

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_bss_decoder.hpp
# Opt level: O0

void __thiscall
duckdb::BssDecoder::GetBatch<float>
          (BssDecoder *this,data_ptr_t values_target_ptr,uint32_t batch_size)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  ostream *poVar4;
  runtime_error *this_00;
  uint in_EDX;
  long in_RSI;
  long *in_RDI;
  uint32_t i;
  data_ptr_t input_bytes;
  uint32_t byte_offset;
  uint32_t num_buffer_values;
  stringstream error;
  uint64_t in_stack_fffffffffffffde8;
  ByteBuffer *in_stack_fffffffffffffdf0;
  uint local_1ec;
  uint local_1dc;
  string local_1d0 [48];
  stringstream local_1a0 [16];
  ostream local_190 [380];
  uint local_14;
  long local_10;
  
  if ((in_RDI[1] & 3U) != 0) {
    ::std::__cxx11::stringstream::stringstream(local_1a0);
    poVar4 = ::std::operator<<(local_190,"Data buffer size for the BYTE_STREAM_SPLIT encoding (");
    poVar4 = (ostream *)::std::ostream::operator<<(poVar4,in_RDI[1]);
    poVar4 = ::std::operator<<(poVar4,") should be a multiple of the type size (");
    poVar4 = (ostream *)::std::ostream::operator<<(poVar4,4);
    ::std::operator<<(poVar4,")");
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::stringstream::str();
    ::std::runtime_error::runtime_error(this_00,local_1d0);
    __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
  }
  uVar2 = in_RDI[1];
  local_14 = in_EDX;
  local_10 = in_RSI;
  ByteBuffer::available(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  for (local_1dc = 0; local_1dc < 4; local_1dc = local_1dc + 1) {
    lVar3 = *in_RDI;
    uVar1 = *(uint *)(in_RDI + 2);
    for (local_1ec = 0; local_1ec < local_14; local_1ec = local_1ec + 1) {
      *(undefined1 *)(local_10 + (ulong)local_1dc + (ulong)local_1ec * 4) =
           *(undefined1 *)
            (lVar3 + (ulong)(local_1dc * (int)(uVar2 >> 2)) + (ulong)uVar1 + (ulong)local_1ec);
    }
  }
  *(uint *)(in_RDI + 2) = local_14 + (int)in_RDI[2];
  return;
}

Assistant:

void GetBatch(data_ptr_t values_target_ptr, uint32_t batch_size) {
		if (buffer_.len % sizeof(T) != 0) {
			std::stringstream error;
			error << "Data buffer size for the BYTE_STREAM_SPLIT encoding (" << buffer_.len
			      << ") should be a multiple of the type size (" << sizeof(T) << ")";
			throw std::runtime_error(error.str());
		}
		uint32_t num_buffer_values = buffer_.len / sizeof(T);

		buffer_.available((value_offset_ + batch_size) * sizeof(T));

		for (uint32_t byte_offset = 0; byte_offset < sizeof(T); ++byte_offset) {
			data_ptr_t input_bytes = buffer_.ptr + byte_offset * num_buffer_values + value_offset_;
			for (uint32_t i = 0; i < batch_size; ++i) {
				values_target_ptr[byte_offset + i * sizeof(T)] = *(input_bytes + i);
			}
		}
		value_offset_ += batch_size;
	}